

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryContextTests.cpp
# Opt level: O0

void deqp::egl::createQueryContextGroups<deqp::egl::GetCurrentSurfaceCase>
               (EglTestContext *eglTestCtx,TestCaseGroup *group)

{
  pointer this;
  bool bVar1;
  EGLint surfaceTypeMask;
  GetCurrentSurfaceCase *this_00;
  pointer pRVar2;
  char *name;
  reference filters;
  __normal_iterator<deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
  local_70;
  __normal_iterator<deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
  local_68;
  __normal_iterator<const_deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
  local_60;
  const_iterator listIter;
  FilterList local_48;
  undefined1 local_30 [8];
  vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> filterLists;
  TestCaseGroup *group_local;
  EglTestContext *eglTestCtx_local;
  
  filterLists.
  super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)group;
  std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::vector
            ((vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> *)
             local_30);
  eglu::FilterList::FilterList(&local_48);
  getDefaultRenderFilterLists
            ((vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> *)
             local_30,&local_48);
  eglu::FilterList::~FilterList(&local_48);
  local_68._M_current =
       (RenderFilterList *)
       std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::begin
                 ((vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
                   *)local_30);
  __gnu_cxx::
  __normal_iterator<deqp::egl::RenderFilterList_const*,std::vector<deqp::egl::RenderFilterList,std::allocator<deqp::egl::RenderFilterList>>>
  ::__normal_iterator<deqp::egl::RenderFilterList*>
            ((__normal_iterator<deqp::egl::RenderFilterList_const*,std::vector<deqp::egl::RenderFilterList,std::allocator<deqp::egl::RenderFilterList>>>
              *)&local_60,&local_68);
  while( true ) {
    local_70._M_current =
         (RenderFilterList *)
         std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::end
                   ((vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
                     *)local_30);
    bVar1 = __gnu_cxx::operator!=(&local_60,&local_70);
    this = filterLists.
           super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (!bVar1) break;
    this_00 = (GetCurrentSurfaceCase *)operator_new(0xd8);
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
             ::operator->(&local_60);
    name = NamedFilterList::getName(&pRVar2->super_NamedFilterList);
    filters = __gnu_cxx::
              __normal_iterator<const_deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
              ::operator*(&local_60);
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
             ::operator->(&local_60);
    surfaceTypeMask = RenderFilterList::getSurfaceTypeMask(pRVar2);
    GetCurrentSurfaceCase::GetCurrentSurfaceCase
              (this_00,eglTestCtx,name,"",(FilterList *)filters,surfaceTypeMask);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    __gnu_cxx::
    __normal_iterator<const_deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
    ::operator++(&local_60,0);
  }
  std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::~vector
            ((vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> *)
             local_30);
  return;
}

Assistant:

void createQueryContextGroups (EglTestContext& eglTestCtx, tcu::TestCaseGroup* group)
{
	std::vector<RenderFilterList> filterLists;

	getDefaultRenderFilterLists(filterLists, eglu::FilterList());

	for (std::vector<RenderFilterList>::const_iterator listIter = filterLists.begin(); listIter != filterLists.end(); listIter++)
		group->addChild(new QueryContextClass(eglTestCtx, listIter->getName(), "", *listIter, listIter->getSurfaceTypeMask()));
}